

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall basisu::vector<int>::erase(vector<int> *this,int *pFirst,int *pEnd)

{
  uint uVar1;
  int *piVar2;
  void *__dest;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  if (pEnd < pFirst) {
    __assert_fail("pFirst <= pEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x318,"void basisu::vector<int>::erase(T *, T *) [T = int]");
  }
  piVar2 = this->m_p;
  if (piVar2 <= pFirst) {
    uVar1 = this->m_size;
    if (pFirst <= piVar2 + uVar1) {
      if ((pEnd < piVar2) || (piVar2 + uVar1 < pEnd)) {
        __assert_fail("pEnd >= begin() && pEnd <= end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                      ,0x31a,"void basisu::vector<int>::erase(T *, T *) [T = int]");
      }
      uVar4 = (long)pFirst - (long)piVar2 >> 2;
      if (uVar4 >> 0x20 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                      ,799,"void basisu::vector<int>::erase(T *, T *) [T = int]");
      }
      uVar6 = (long)pEnd - (long)pFirst >> 2;
      if (uVar6 >> 0x20 == 0) {
        iVar5 = (int)uVar6;
        uVar3 = (int)uVar4 + iVar5;
        if (uVar3 <= uVar1) {
          if (pEnd != pFirst) {
            __dest = (void *)((long)piVar2 + ((long)pFirst - (long)piVar2));
            memmove(__dest,(void *)(((long)pEnd - (long)pFirst) + (long)__dest),
                    (ulong)(uVar1 - uVar3) << 2);
            this->m_size = this->m_size - iVar5;
          }
          return;
        }
        __assert_fail("(start + n) <= m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                      ,0x2e3,"void basisu::vector<int>::erase(uint32_t, uint32_t) [T = int]");
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                    ,0x326,"void basisu::vector<int>::erase(T *, T *) [T = int]");
    }
  }
  __assert_fail("pFirst >= begin() && pFirst <= end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                ,0x319,"void basisu::vector<int>::erase(T *, T *) [T = int]");
}

Assistant:

inline void erase(T *pFirst, T *pEnd)
      {
         assert(pFirst <= pEnd);
         assert(pFirst >= begin() && pFirst <= end());
         assert(pEnd >= begin() && pEnd <= end());

         int64_t ofs = pFirst - begin();
         if ((ofs < 0) || (ofs > UINT32_MAX))
         {
            assert(0);
            return;
         }

         int64_t n = pEnd - pFirst;
         if ((n < 0) || (n > UINT32_MAX))
         {
            assert(0);
            return;
         }

         erase((uint32_t)ofs, (uint32_t)n);
      }